

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

reference __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
::iterator::operator*(iterator *this)

{
  ctrl_t *pcVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  slot_type *psVar5;
  slot_type *psVar6;
  uint64_t uVar7;
  bool bVar8;
  slot_type *psVar9;
  ulong uVar10;
  key_arg<std::__cxx11::basic_string<char>_> *in_RSI;
  iterator iVar11;
  
  pcVar1 = this->ctrl_;
  if (pcVar1 == (ctrl_t *)0x0) {
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
    ::iterator::operator*((iterator *)this);
LAB_002411d1:
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (pcVar1 == kEmptyGroup + 0x10) goto LAB_002411d1;
    if (kSentinel < *pcVar1) {
      return (reference)(this->field_1).slot_;
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
  ::iterator::operator*((iterator *)this);
  psVar2 = *(slot_type **)this;
  if ((psVar2 == (slot_type *)(kEmptyGroup + 0x10) || psVar2 == (slot_type *)0x0) ||
     (-1 < *(char *)psVar2)) {
    psVar3 = (slot_type *)(in_RSI->_M_dataplus)._M_p;
    if ((psVar3 != (slot_type *)(kEmptyGroup + 0x10) && psVar3 != (slot_type *)0x0) &&
       (*(char *)psVar3 < '\0')) goto LAB_002412ca;
    if (psVar2 == (slot_type *)(kEmptyGroup + 0x10) && psVar3 == (slot_type *)(kEmptyGroup + 0x10))
    {
LAB_002412bd:
      return (reference)CONCAT71((int7)((ulong)psVar2 >> 8),psVar2 == psVar3);
    }
    if ((psVar2 == (slot_type *)(kEmptyGroup + 0x10)) ==
        (psVar3 == (slot_type *)(kEmptyGroup + 0x10))) {
      if (psVar2 == (slot_type *)0x0 || psVar3 == (slot_type *)0x0) goto LAB_002412bd;
      if ((psVar3 == (slot_type *)kSooControl) == (psVar2 == (slot_type *)kSooControl)) {
        this = (iterator *)
               ((anon_union_8_1_a8a14541_for_iterator_2 *)
               &((remove_const_t<std::__cxx11::basic_string<char>_> *)this)->_M_string_length)->
               slot_;
        psVar4 = (slot_type *)in_RSI->_M_string_length;
        if (psVar2 == (slot_type *)kSooControl) {
          bVar8 = (slot_type *)this == psVar4;
        }
        else {
          psVar9 = psVar4;
          psVar5 = psVar3;
          psVar6 = (slot_type *)this;
          if (psVar3 < psVar2) {
            psVar9 = (slot_type *)this;
            psVar5 = psVar2;
            psVar6 = psVar4;
          }
          in_RSI = (key_arg<std::__cxx11::basic_string<char>_> *)
                   CONCAT71((int7)((ulong)psVar5 >> 8),psVar5 < psVar6);
          bVar8 = psVar6 <= psVar9 && psVar5 < psVar6;
        }
        if (bVar8) goto LAB_002412bd;
      }
      goto LAB_002412d4;
    }
  }
  else {
    container_internal::operator==();
LAB_002412ca:
    container_internal::operator==();
  }
  container_internal::operator==();
LAB_002412d4:
  container_internal::operator==();
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
              *)this);
  uVar10 = in_RSI->_M_string_length;
  uVar7 = hash_internal::MixingHashState::CombineContiguousImpl
                    (&hash_internal::MixingHashState::kSeed,(in_RSI->_M_dataplus)._M_p,uVar10);
  uVar10 = (uVar10 ^ uVar7) * -0x234dd359734ecb13;
  iVar11 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
           ::find_non_soo<std::__cxx11::string>
                     ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
                       *)this,in_RSI,
                      uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                      (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                      (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                      (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38);
  return (reference)iVar11.ctrl_;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }